

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall
QComboBoxPrivateContainer::resizeEvent(QComboBoxPrivateContainer *this,QResizeEvent *e)

{
  long lVar1;
  int iVar2;
  QStyle *pQVar3;
  long in_FS_OFFSET;
  QStyleHintReturnMask local_108;
  QStyleOption myOpt;
  QStyleOptionComboBox opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&opt,0xaa,0x90);
  comboStyleOption(&opt,this);
  pQVar3 = QWidget::style(&this->combo->super_QWidget);
  iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x19,&opt,this->combo,0);
  if (iVar2 == 0) {
    QWidget::clearMask((QWidget *)this);
  }
  else {
    myOpt.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    myOpt.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    myOpt._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    myOpt.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    myOpt.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    myOpt.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    myOpt._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    myOpt._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOption::QStyleOption(&myOpt,1,0);
    QStyleOption::initFrom(&myOpt,(QWidget *)this);
    local_108.super_QStyleHintReturn = (QStyleHintReturn)&DAT_aaaaaaaaaaaaaaaa;
    local_108.region.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    QStyleHintReturnMask::QStyleHintReturnMask(&local_108);
    pQVar3 = QWidget::style(&this->combo->super_QWidget);
    iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x50,&myOpt,this,&local_108);
    if (iVar2 != 0) {
      QWidget::setMask((QWidget *)this,&local_108.region);
    }
    QStyleHintReturnMask::~QStyleHintReturnMask(&local_108);
    QStyleOption::~QStyleOption(&myOpt);
  }
  QWidget::resizeEvent((QWidget *)this,e);
  QStyleOptionComboBox::~QStyleOptionComboBox(&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivateContainer::resizeEvent(QResizeEvent *e)
{
    QStyleOptionComboBox opt = comboStyleOption();
    if (combo->style()->styleHint(QStyle::SH_ComboBox_Popup, &opt, combo)) {
        QStyleOption myOpt;
        myOpt.initFrom(this);
        QStyleHintReturnMask mask;
        if (combo->style()->styleHint(QStyle::SH_Menu_Mask, &myOpt, this, &mask)) {
            setMask(mask.region);
        }
    } else {
        clearMask();
    }
    QFrame::resizeEvent(e);
}